

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createAdd(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  Value *local_58;
  Value *local_50;
  string local_48;
  
  local_58 = rhs;
  local_50 = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0xbb,"Value *flow::IRBuilder::createAdd(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ == Number) {
    if (lhs == (Value *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(lhs,&Value::typeinfo,
                             &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    }
    if (lVar1 == 0) {
      bVar3 = true;
    }
    else {
      if (rhs == (Value *)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(rhs,&Value::typeinfo,
                               &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
      }
      bVar3 = lVar2 == 0;
      if (!bVar3) {
        local_48._M_dataplus._M_p = (pointer)(*(long *)(lVar2 + 0x48) + *(long *)(lVar1 + 0x48));
        rhs = (Value *)IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                                 (this->program_,&this->program_->numbers_,(long *)&local_48);
      }
    }
    if (bVar3) {
      makeName(&local_48,this,name);
      rhs = (Value *)insert<flow::BinaryInstr<(flow::BinaryOperator)0,(flow::LiteralType)2>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                               (this,&local_50,&local_58,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    return (Value *)(BinaryInstr<(flow::BinaryOperator)0,_(flow::LiteralType)2> *)rhs;
  }
  __assert_fail("lhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0xbc,"Value *flow::IRBuilder::createAdd(Value *, Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createAdd(Value* lhs, Value* rhs, const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(lhs))
    if (auto b = dynamic_cast<ConstantInt*>(rhs))
      return get(a->get() + b->get());

  return insert<IAddInstr>(lhs, rhs, makeName(name));
}